

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int countint(TValue *key,int *nums)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  luai_Cast u;
  uint local_10;
  
  uVar2 = 0;
  if (key->tt_ == 3) {
    dVar1 = (key->value_).n;
    local_10 = SUB84(dVar1 + 6755399441055744.0,0);
    bVar4 = local_10 - 1 < 0x40000000;
    if (bVar4 && (double)(int)local_10 == dVar1) {
      iVar3 = luaO_ceillog2(local_10);
      nums[iVar3] = nums[iVar3] + 1;
    }
    uVar2 = (uint)(bVar4 && (double)(int)local_10 == dVar1);
  }
  return uVar2;
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}